

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::prepareDataPhrasesFromWordvec
               (string *dir_name,string *data_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               *words_dict)

{
  pointer pcVar1;
  directory_iterator dVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  const_iterator cVar7;
  double *pdVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  undefined8 uVar10;
  bool bVar11;
  long local_510;
  ofstream of;
  ios_base local_418 [264];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_310;
  ifstream fi;
  dir_itr_imp local_300 [16];
  byte abStack_2f0 [488];
  size_type *local_108;
  path targetDir;
  long local_e0;
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string line;
  vector<double,_std::allocator<double>_> result;
  directory_iterator local_68;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_50;
  error_code *local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_108 = &targetDir.m_pathname._M_string_length;
  pcVar1 = (dir_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_68,(path *)&local_108,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream(&local_510,(string *)data_filename,_S_out);
  local_310 = local_68.m_imp.px;
  if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
    UNLOCK();
  }
  _fi = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_68;
  if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
    UNLOCK();
  }
  local_50 = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_310);
  local_310 = eod.m_imp.px;
  if (eod.m_imp.px == (dir_itr_imp *)0x0) {
    local_38.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
    local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
    if (eod.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_310);
  local_310.px = local_50.px;
  if (local_50.px == (dir_itr_imp *)0x0) {
    local_40.px = (dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_50.px = *(int *)local_50.px + 1;
    UNLOCK();
    local_40.px = local_50.px;
    if (local_50.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_50.px = *(int *)local_50.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_310);
  while (dVar2.m_imp.px = local_38.m_imp.px,
        local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) {
    if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
      if ((local_40.px == (dir_itr_imp *)0x0) || (*(long *)(local_40.px + 0x38) == 0)) break;
      if ((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) {
        __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                      "/usr/include/boost/filesystem/directory.hpp",0x140,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
    }
    local_48 = (error_code *)((long)local_38.m_imp.px + 8);
    boost::filesystem::detail::status((path *)&local_310,local_48);
    if ((int)local_310.px == 2) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)((long)dVar2.m_imp.px + 8),
                          *(long *)((long)dVar2.m_imp.px + 0x10));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      boost::filesystem::path::extension();
      iVar4 = boost::filesystem::path::compare((path *)&local_310,"swp");
      if (local_310.px != local_300) {
        operator_delete(local_310.px);
      }
      if (iVar4 != 0) {
        std::ifstream::ifstream((istream *)&local_310,(string *)local_48,_S_in);
        if ((abStack_2f0[*(long *)(local_310.px + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)((long)dVar2.m_imp.px + 8),
                              *(long *)((long)dVar2.m_imp.px + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::ifstream::~ifstream(&local_310);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_38.m_imp);
          bVar11 = false;
          goto LAB_0010e2b3;
        }
        local_a8 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        line.field_2._8_8_ = 0;
        while( true ) {
          cVar3 = std::ios::widen((char)*(undefined8 *)(local_310.px + -0x18) +
                                  (char)(istream *)&local_310);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_310,(string *)local_a8,cVar3);
          uVar10 = line.field_2._8_8_;
          if ((((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) ||
             (line._M_dataplus._M_p == (pointer)0x0)) break;
          cVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&words_dict->_M_h,(key_type *)local_a8);
          if (cVar7.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"word ",5);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_a8,(long)line._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," in file ",9);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)((long)dVar2.m_imp.px + 8),
                                *(long *)((long)dVar2.m_imp.px + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," isn\'t found in dictionary",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          else if (line.field_2._8_8_ == 0) {
            std::vector<double,_std::allocator<double>_>::operator=
                      ((vector<double,_std::allocator<double>_> *)((long)&line.field_2 + 8),
                       (vector<double,_std::allocator<double>_> *)
                       ((long)cVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                              ._M_cur + 0x28));
          }
          else {
            pdVar8 = (((vector<double,_std::allocator<double>_> *)
                      ((long)cVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_true>
                             ._M_cur + 0x28))->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar10 = line.field_2._8_8_;
            do {
              *(double *)uVar10 = *(double *)uVar10 + *pdVar8;
              uVar10 = uVar10 + 8;
              pdVar8 = pdVar8 + 1;
            } while ((double *)uVar10 != (double *)0x0);
          }
        }
        for (; (double *)uVar10 != (double *)0x0; uVar10 = (double *)(uVar10 + 8)) {
          poVar5 = std::ostream::_M_insert<double>(*(double *)uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        }
        boost::filesystem::path::filename();
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,targetDir.m_pathname.field_2._8_8_,
                   local_e0 + targetDir.m_pathname.field_2._8_8_);
        pbVar9 = boost::io::detail::
                 quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                           ((basic_ostream<char,_std::char_traits<char>_> *)&local_510,&local_c8,'&'
                            ,'\"');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar9 + -0x18) + (char)pbVar9);
        std::ostream::put((char)pbVar9);
        std::ostream::flush();
        if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_d8) {
          operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
        }
        if (line.field_2._8_8_ != 0) {
          operator_delete((void *)line.field_2._8_8_);
        }
        if (local_a8 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_a8);
        }
        std::ifstream::~ifstream((istream *)&local_310);
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
  bVar11 = true;
LAB_0010e2b3:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_50);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  local_510 = _VTT;
  *(undefined8 *)((long)&local_510 + *(long *)(_VTT + -0x18)) = _sentry;
  std::filebuf::~filebuf((filebuf *)&of);
  std::ios_base::~ios_base(local_418);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68.m_imp);
  if (local_108 != &targetDir.m_pathname._M_string_length) {
    operator_delete(local_108);
  }
  return bVar11;
}

Assistant:

bool prepareDataPhrasesFromWordvec(const std::string& dir_name, const std::string& data_filename, const std::unordered_map<std::string, std::vector<double>>& words_dict)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<double> result;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, std::vector<double>>::const_iterator it = words_dict.find(line);
                    if (it == words_dict.end())
                    {
                        std::cerr << "word " << line << " in file " << p.string() << " isn't found in dictionary" << std::endl;
                        //return false;
                        continue;
                    }
                    
                    if (result.size() == 0)
                        result = it->second;
                    else
                        std::transform (result.begin(), result.end(), it->second.begin(), result.begin(), std::plus<double>());                            
                }
                
                for (const double elem: result)
                    of << elem << ",";
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }